

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_StartCurrentNetworkSuccess_Test::TestBody
          (InterpreterTestSuite_PC_StartCurrentNetworkSuccess_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this_00;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Alloc_hider _Var4;
  element_type *peVar5;
  Registry *pRVar6;
  Status SVar7;
  bool bVar8;
  CommissionerAppMock *pCVar9;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar10;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar11;
  _func_int **pp_Var12;
  long lVar13;
  char *pcVar14;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  uint8_t camIdx;
  Status local_529;
  _Any_data local_528;
  undefined1 local_518 [16];
  _Any_data local_508;
  undefined1 local_4f8 [16];
  _Any_data local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Any_data local_4c8;
  code *local_4b8;
  code *pcStack_4b0;
  internal local_4a0;
  undefined7 uStack_49f;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  undefined1 local_490 [8];
  undefined **local_488;
  undefined1 local_480 [8];
  undefined1 local_478 [16];
  _Alloc_hider local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  element_type local_458 [2];
  Value value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_3f8;
  Matcher<const_ot::commissioner::Config_&> local_3d8;
  undefined8 uStack_3c0;
  CommissionerAppMockPtr commissionerAppMocks [2];
  string local_398;
  State local_378;
  State local_374;
  UnixTime local_370;
  UnixTime local_368;
  Error local_360;
  Error local_338;
  Error local_310;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  pRVar6 = ctx.mRegistry;
  value.mError._0_8_ = &value.mError.mMessage._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
  local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
  _vptr_MatcherBase = (_func_int **)0x0;
  local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)0x0;
  local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_490 = (undefined1  [8])local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_374,0,0,0,0,0);
  local_528._M_unused._M_object = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"net1","");
  local_4e8._M_unused._M_object = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
  local_508._M_unused._M_object = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
  commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(commissionerAppMocks + 1);
  std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"");
  local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
       (_func_int **)0x0;
  local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
  local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4c8._M_unused._M_object = &local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"domain1","");
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  pp_Var12 = (_func_int **)0x2ff875;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"","");
  ot::commissioner::UnixTime::UnixTime(&local_368,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3f8,(string *)local_490,
             local_374,(string *)&local_528,1,(string *)&local_4e8,(string *)&local_508,
             (Timestamp)0x0,0,(string *)commissionerAppMocks,(ByteArray *)&local_3d8,
             (string *)&local_4c8,'\0',0,&local_398,local_368,0x103f);
  camIdx = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
  local_529 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (&local_4a0,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&camIdx,&local_529);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if ((code **)local_4c8._M_unused._0_8_ != &local_4b8) {
    operator_delete(local_4c8._M_unused._M_object);
  }
  if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
      (_func_int **)0x0) {
    operator_delete(local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase)
    ;
  }
  if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
    operator_delete(commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_508._M_unused._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8) {
    operator_delete(local_508._M_unused._M_object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_unused._0_8_ != &local_4d8) {
    operator_delete(local_4e8._M_unused._M_object);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_528._M_unused._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_518) {
    operator_delete(local_528._M_unused._M_object);
  }
  if (local_490 != (undefined1  [8])local_480) {
    operator_delete((void *)local_490);
  }
  if (local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
      _vptr_MatcherBase != (_func_int **)0x0) {
    operator_delete(local_3f8.
                    super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                    _vptr_MatcherBase);
  }
  if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
    operator_delete((void *)value.mError._0_8_);
  }
  p_Var3 = local_498;
  if (local_4a0 == (internal)0x0) {
    testing::Message::Message((Message *)&br);
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var12 = local_498->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x378,(char *)pp_Var12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_498 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0015eb77;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498->_vptr__Sp_counted_base !=
        local_498 + 1) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_498->_vptr__Sp_counted_base);
    }
  }
  else {
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498->_vptr__Sp_counted_base !=
          local_498 + 1) {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_498->_vptr__Sp_counted_base);
      }
      operator_delete(p_Var3);
    }
    pRVar6 = ctx.mRegistry;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
    local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)0x0;
    local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)0x0;
    local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_490 = (undefined1  [8])local_480;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_378,0,0,0,0,0);
    local_528._M_unused._M_object = local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"net2","");
    local_4e8._M_unused._M_object = &local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
    local_508._M_unused._M_object = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
    commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(commissionerAppMocks + 1);
    std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"");
    local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)0x0;
    local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
    local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4c8._M_unused._M_object = &local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"domain1","");
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    pp_Var12 = (_func_int **)0x2ff875;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"","");
    ot::commissioner::UnixTime::UnixTime(&local_370,0);
    pcVar14 = (char *)(ulong)(uint)local_378;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3f8,
               (string *)local_490,local_378,(string *)&local_528,2,(string *)&local_4e8,
               (string *)&local_508,(Timestamp)0x0,0,(string *)commissionerAppMocks,
               (ByteArray *)&local_3d8,(string *)&local_4c8,'\0',0,&local_398,local_370,0x103f);
    camIdx = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
    local_529 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (&local_4a0,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&camIdx,&local_529);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    if ((code **)local_4c8._M_unused._0_8_ != &local_4b8) {
      operator_delete(local_4c8._M_unused._M_object);
    }
    if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      operator_delete(local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.
                      _vptr_MatcherBase);
    }
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
      operator_delete(commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_508._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8) {
      operator_delete(local_508._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_unused._0_8_ != &local_4d8) {
      operator_delete(local_4e8._M_unused._M_object);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_528._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_518) {
      operator_delete(local_528._M_unused._M_object);
    }
    if (local_490 != (undefined1  [8])local_480) {
      operator_delete((void *)local_490);
    }
    if (local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
        _vptr_MatcherBase != (_func_int **)0x0) {
      operator_delete(local_3f8.
                      super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                      _vptr_MatcherBase);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    p_Var3 = local_498;
    if (local_4a0 != (internal)0x0) {
      if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498->_vptr__Sp_counted_base !=
            local_498 + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_498->_vptr__Sp_counted_base);
        }
        operator_delete(p_Var3);
      }
      ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
      br.mNetworkId.mId = value.mError.mCode;
      SVar7 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br);
      local_490[0] = SVar7;
      local_528._M_unused._M_member_pointer =
           local_528._M_unused._M_member_pointer & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                 "RegistryStatus::kSuccess",local_490,(Status *)local_528._M_pod_data);
      _Var4 = value.mError.mMessage._M_dataplus;
      if ((undefined1)value.mError.mCode == kNone) {
        testing::Message::Message((Message *)local_490);
        if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)value.mError.mMessage._M_dataplus._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_528,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x381,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_528,(Message *)local_490);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_528);
        if (local_490 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_490 + 8))();
        }
        _Var4._M_p = value.mError.mMessage._M_dataplus._M_p;
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(_Var4._M_p);
        }
      }
      else {
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(_Var4._M_p);
        }
        camIdx = '\0';
        pCVar9 = (CommissionerAppMock *)operator_new(0x1838);
        memset(pCVar9,0,0x1838);
        CommissionerAppMock::CommissionerAppMock(pCVar9);
        commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = pCVar9;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                  (&commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   pCVar9);
        pCVar9 = (CommissionerAppMock *)operator_new(0x1838);
        memset(pCVar9,0,0x1838);
        CommissionerAppMock::CommissionerAppMock(pCVar9);
        commissionerAppMocks[1].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = pCVar9;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                  (&commissionerAppMocks[1].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   pCVar9);
        local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)operator_new(8);
        ((local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
          super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_0039a928;
        local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
        _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00395d20;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                  (&local_3f8.
                    super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
                    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>
                   .impl_.
                   super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
        _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00395cd8;
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)operator_new(8);
        ((local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
          super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
             (_func_int **)&PTR__MatcherBase_00395d88;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                  (&local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                   super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
             (_func_int **)&PTR__MatcherBase_00395d40;
        CommissionerAppStaticExpecter::gmock_Create
                  ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    *)local_490,&ctx.mCommissionerAppStaticExpecter,&local_3f8,&local_3d8);
        testing::internal::GetWithoutMatchers();
        pTVar10 = testing::internal::
                  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  ::InternalExpectedAt
                            ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                              *)local_490,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                             ,0x386,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
        pTVar10 = testing::internal::
                  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  ::Times(pTVar10,2);
        paVar1 = &local_310.mMessage.field_2;
        local_310.mCode = kNone;
        local_310.mMessage._M_string_length = 0;
        local_310.mMessage.field_2._M_local_buf[0] = '\0';
        local_310.mMessage._M_dataplus._M_p = (pointer)paVar1;
        testing::Return<ot::commissioner::Error>((testing *)&local_4a0,&local_310);
        local_398._M_dataplus._M_p = (pointer)CONCAT71(uStack_49f,local_4a0);
        local_398._M_string_length = (size_type)local_498;
        if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_498->_M_use_count = local_498->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_498->_M_use_count = local_498->_M_use_count + 1;
          }
        }
        local_528._M_unused._M_object = commissionerAppMocks;
        local_518._0_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:905:30)>
             ::_M_manager;
        local_518._8_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:905:30)>
             ::_M_invoke;
        local_528._8_8_ = &camIdx;
        local_398.field_2._M_allocated_capacity = (size_type)local_528._M_unused._M_object;
        local_398.field_2._8_8_ = &camIdx;
        std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                  ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                   &local_4e8,
                   (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                   &local_528);
        local_4f8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4f8._8_8_ = 0;
        local_508._M_unused._M_object = (pointer)0x0;
        local_508._8_8_ = 0;
        local_508._M_unused._M_object = operator_new(0x20);
        *(undefined8 *)local_508._M_unused._0_8_ = 0;
        *(undefined8 *)((long)local_508._M_unused._0_8_ + 8) = 0;
        *(undefined8 *)((long)local_508._M_unused._0_8_ + 0x10) = 0;
        *(undefined8 *)((long)local_508._M_unused._0_8_ + 0x18) = local_4d8._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(undefined4 *)local_508._M_unused._0_8_ = local_4e8._0_4_;
          *(undefined4 *)((long)local_508._M_unused._0_8_ + 4) = local_4e8._4_4_;
          *(undefined4 *)((long)local_508._M_unused._0_8_ + 8) = local_4e8._8_4_;
          *(undefined4 *)((long)local_508._M_unused._0_8_ + 0xc) = local_4e8._12_4_;
          *(size_type *)((long)local_508._M_unused._0_8_ + 0x10) = local_4d8._M_allocated_capacity;
        }
        local_508._8_8_ = 0;
        local_4f8._0_8_ = std::_Function_handler::operator_cast_to_Action;
        local_4f8._8_8_ = std::_Function_handler::operator_cast_to_Action;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(code *)local_518._0_8_)(&local_528,&local_528,3);
        }
        __l._M_len = 1;
        __l._M_array = (iterator)&local_508;
        std::
        vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
        ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                  *)&value,__l,(allocator_type *)&local_528);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(code *)local_4f8._0_8_)(&local_508,&local_508,3);
        }
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    *)&value.mError.mMessage.field_2,(ReturnAction *)&local_398);
        local_4b8 = (code *)0x0;
        pcStack_4b0 = (code *)0x0;
        local_4c8._M_unused._M_object = (void *)0x0;
        local_4c8._8_8_ = 0;
        local_4c8._M_unused._M_object = operator_new(0x38);
        *(undefined8 *)local_4c8._M_unused._0_8_ = value.mError._0_8_;
        *(pointer *)((long)local_4c8._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
        *(size_type *)((long)local_4c8._M_unused._0_8_ + 0x10) =
             value.mError.mMessage._M_string_length;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mCode = kNone;
        value.mError._4_4_ = 0;
        value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
        *(code **)((long)local_4c8._M_unused._0_8_ + 0x28) = (code *)0x0;
        *(code **)((long)local_4c8._M_unused._0_8_ + 0x18) = (code *)0x0;
        *(code **)((long)local_4c8._M_unused._0_8_ + 0x20) = (code *)0x0;
        *(size_type *)((long)local_4c8._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
        if (value.mData._M_dataplus._M_p != (pointer)0x0) {
          *(code **)((long)local_4c8._M_unused._0_8_ + 0x18) =
               (code *)CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                                value.mError.mMessage.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_4c8._M_unused._0_8_ + 0x20) =
               value.mError.mMessage.field_2._8_8_;
          *(pointer *)((long)local_4c8._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
          value.mData._M_dataplus._M_p = (pointer)0x0;
          value.mData._M_string_length = 0;
        }
        local_4c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4b8 = std::_Function_handler::operator_cast_to_Action;
        pcStack_4b0 = std::_Function_handler::operator_cast_to_Action;
        std::
        vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
        ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                   *)&value);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
        ::WillRepeatedly(pTVar10,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)&local_4c8);
        if (local_4b8 != (code *)0x0) {
          (*local_4b8)(&local_4c8,&local_4c8,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length);
        }
        if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(local_310.mMessage._M_dataplus._M_p);
        }
        local_478._8_8_ = &PTR__MatcherBase_00395d20;
        if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
        }
        local_488 = &PTR__MatcherBase_00395d88;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._0_8_);
        }
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
             (_func_int **)&PTR__MatcherBase_00395d88;
        if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
        _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00395d20;
        if (local_3f8.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3f8.
                     super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        peVar5 = commissionerAppMocks[0].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_528._8_8_ = operator_new(8);
        (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_528._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_003994f0;
        local_528._M_unused._M_object = &PTR__MatcherBase_00396e08;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_518,
                   (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_528._8_8_);
        local_528._M_unused._M_object = &PTR__MatcherBase_00396dc0;
        local_4e8._8_8_ = operator_new(8);
        (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_4e8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_003995b8;
        local_4e8._M_unused._M_object = &PTR__MatcherBase_003968b0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4d8._M_allocated_capacity,
                   (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_4e8._8_8_);
        local_4e8._M_unused._M_object = &PTR__MatcherBase_00396868;
        local_508._8_8_ = operator_new(8);
        (((MatcherInterface<const_unsigned_short_&> *)local_508._8_8_)->
        super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_00399670;
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a78;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8,
                   (MatcherInterface<const_unsigned_short_&> *)local_508._8_8_);
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a30;
        CommissionerAppMock::gmock_Start
                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,peVar5,
                   (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_528,
                   (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_4e8,(Matcher<unsigned_short> *)&local_508);
        testing::internal::GetWithoutMatchers();
        pTVar11 = testing::internal::
                  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  ::InternalExpectedAt
                            ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                              *)&value,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                             ,0x38b,"*commissionerAppMocks[0]","Start(_, _, _)");
        pTVar11 = testing::internal::
                  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  ::Times(pTVar11,2);
        paVar1 = &local_338.mMessage.field_2;
        local_338.mCode = kNone;
        local_338.mMessage._M_string_length = 0;
        local_338.mMessage.field_2._M_local_buf[0] = '\0';
        local_338.mMessage._M_dataplus._M_p = (pointer)paVar1;
        testing::Return<ot::commissioner::Error>((testing *)local_4c8._M_pod_data,&local_338);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_490,(ReturnAction *)local_4c8._M_pod_data);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar11,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)local_490);
        if (local_480 != (undefined1  [8])0x0) {
          (*(code *)local_480)(local_490,local_490,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(local_338.mMessage._M_dataplus._M_p);
        }
        value.mData.field_2._M_allocated_capacity = (size_type)&PTR__MatcherBase_00396e08;
        if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
        }
        value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_003968b0;
        if (value.mData._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value.mData._M_string_length);
        }
        value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                     value.mError.mMessage.field_2._M_local_buf[0]) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                              value.mError.mMessage.field_2._M_local_buf[0]));
        }
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_);
        }
        local_4e8._M_unused._M_object = &PTR__MatcherBase_003968b0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._M_allocated_capacity
                    );
        }
        local_528._M_unused._M_object = &PTR__MatcherBase_00396e08;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._0_8_);
        }
        peVar5 = commissionerAppMocks[1].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_528._8_8_ = operator_new(8);
        (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_528._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_003994f0;
        local_528._M_unused._M_object = &PTR__MatcherBase_00396e08;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_518,
                   (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_528._8_8_);
        local_528._M_unused._M_object = &PTR__MatcherBase_00396dc0;
        local_4e8._8_8_ = operator_new(8);
        (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_4e8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_003995b8;
        local_4e8._M_unused._M_object = &PTR__MatcherBase_003968b0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4d8._M_allocated_capacity,
                   (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_4e8._8_8_);
        local_4e8._M_unused._M_object = &PTR__MatcherBase_00396868;
        local_508._8_8_ = operator_new(8);
        (((MatcherInterface<const_unsigned_short_&> *)local_508._8_8_)->
        super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_00399670;
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a78;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8,
                   (MatcherInterface<const_unsigned_short_&> *)local_508._8_8_);
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a30;
        CommissionerAppMock::gmock_Start
                  ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,peVar5,
                   (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_528,
                   (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_4e8,(Matcher<unsigned_short> *)&local_508);
        testing::internal::GetWithoutMatchers();
        pTVar11 = testing::internal::
                  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  ::InternalExpectedAt
                            ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                              *)&value,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                             ,0x38d,"*commissionerAppMocks[1]","Start(_, _, _)");
        pTVar11 = testing::internal::
                  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  ::Times(pTVar11,1);
        paVar1 = &local_360.mMessage.field_2;
        local_360.mCode = kNone;
        local_360.mMessage._M_string_length = 0;
        local_360.mMessage.field_2._M_local_buf[0] = '\0';
        local_360.mMessage._M_dataplus._M_p = (pointer)paVar1;
        testing::Return<ot::commissioner::Error>((testing *)local_4c8._M_pod_data,&local_360);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_490,(ReturnAction *)local_4c8._M_pod_data);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar11,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)local_490);
        if (local_480 != (undefined1  [8])0x0) {
          (*(code *)local_480)(local_490,local_490,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(local_360.mMessage._M_dataplus._M_p);
        }
        value.mData.field_2._M_allocated_capacity = (size_type)&PTR__MatcherBase_00396e08;
        if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
        }
        value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_003968b0;
        if (value.mData._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value.mData._M_string_length);
        }
        value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                     value.mError.mMessage.field_2._M_local_buf[0]) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                              value.mError.mMessage.field_2._M_local_buf[0]));
        }
        local_508._M_unused._M_object = &PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_);
        }
        local_4e8._M_unused._M_object = &PTR__MatcherBase_003968b0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._M_allocated_capacity
                    );
        }
        local_528._M_unused._M_object = &PTR__MatcherBase_00396e08;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._0_8_);
        }
        local_4d8._M_allocated_capacity = 0;
        local_4e8._M_unused._M_object = (pointer)0x0;
        local_4e8._8_8_ = 0;
        paVar1 = &value.mData.field_2;
        value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
        value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        value.mData._M_string_length = 0;
        value.mData.field_2._M_allocated_capacity =
             value.mData.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_490 = (undefined1  [8])local_480;
        value.mData._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"start --nwk this","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&local_508,&ctx.mInterpreter,(string *)local_490);
        local_518._0_8_ = local_4d8._M_allocated_capacity;
        local_528._8_8_ = local_4e8._8_8_;
        local_528._M_unused._0_8_ = local_4e8._M_unused._0_8_;
        local_4d8._M_allocated_capacity = local_4f8._0_8_;
        local_4e8._M_unused._M_object = local_508._M_unused._M_object;
        local_4e8._8_8_ = local_508._8_8_;
        local_508._M_unused._M_object =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_508._8_8_ = 0;
        local_4f8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_528);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_508);
        if (local_490 != (undefined1  [8])local_480) {
          operator_delete((void *)local_490);
        }
        ot::commissioner::Interpreter::Eval
                  ((Value *)local_490,&ctx.mInterpreter,(Expression *)&local_4e8);
        this_00 = &value.mError.mMessage;
        value.mError.mCode = local_490._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_488);
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_468);
        if ((element_type *)local_468._M_p != local_458) {
          operator_delete(local_468._M_p);
        }
        if (local_488 != (undefined **)local_478) {
          operator_delete(local_488);
        }
        bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        local_528._M_pod_data[0] = bVar8;
        local_528._8_8_ = (undefined8 *)0x0;
        if (!bVar8) {
          testing::Message::Message((Message *)&local_508);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_490,(internal *)&local_528,(AssertionResult *)0x2ddeee,"false",
                     "true",pcVar14);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x393,(char *)local_490);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4c8,(Message *)&local_508);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
          if (local_490 != (undefined1  [8])local_480) {
            operator_delete((void *)local_490);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_unused._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*local_508._M_unused._M_object + 8))();
          }
          uVar2 = local_528._8_8_;
          if ((undefined8 *)local_528._8_8_ != (undefined8 *)0x0) {
            if (*(undefined8 **)local_528._8_8_ != (undefined8 *)(local_528._8_8_ + 0x10)) {
              operator_delete(*(undefined8 **)local_528._8_8_);
            }
            operator_delete((void *)uVar2);
          }
        }
        ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                  ((MultiNetCommandContext *)&ctx);
        ot::commissioner::JobManager::CleanupJobs
                  (ctx.mInterpreter.mJobManager.
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        local_490 = (undefined1  [8])local_480;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"start --dom this","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&local_508,&ctx.mInterpreter,(string *)local_490);
        local_518._0_8_ = local_4d8._M_allocated_capacity;
        local_528._8_8_ = local_4e8._8_8_;
        local_528._M_unused._0_8_ = local_4e8._M_unused._0_8_;
        local_4d8._M_allocated_capacity = local_4f8._0_8_;
        local_4e8._M_unused._M_object = local_508._M_unused._M_object;
        local_4e8._8_8_ = local_508._8_8_;
        local_508._M_unused._M_object = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_508._8_8_ = 0;
        local_4f8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_528);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_508);
        if (local_490 != (undefined1  [8])local_480) {
          operator_delete((void *)local_490);
        }
        ot::commissioner::Interpreter::Eval
                  ((Value *)local_490,&ctx.mInterpreter,(Expression *)&local_4e8);
        value.mError.mCode = local_490._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_488);
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_468);
        if ((element_type *)local_468._M_p != local_458) {
          operator_delete(local_468._M_p);
        }
        if (local_488 != (undefined **)local_478) {
          operator_delete(local_488);
        }
        bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        local_528._M_pod_data[0] = bVar8;
        local_528._8_8_ = (undefined8 *)0x0;
        if (!bVar8) {
          testing::Message::Message((Message *)&local_508);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_490,(internal *)&local_528,(AssertionResult *)0x2ddeee,"false",
                     "true",pcVar14);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x399,(char *)local_490);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4c8,(Message *)&local_508);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
          if (local_490 != (undefined1  [8])local_480) {
            operator_delete((void *)local_490);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_508._M_unused._0_8_ !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            (**(code **)&(*local_508._M_unused._M_object)->_M_use_count)();
          }
          uVar2 = local_528._8_8_;
          if ((undefined8 *)local_528._8_8_ != (undefined8 *)0x0) {
            if (*(undefined8 **)local_528._8_8_ != (undefined8 *)(local_528._8_8_ + 0x10)) {
              operator_delete(*(undefined8 **)local_528._8_8_);
            }
            operator_delete((void *)uVar2);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mData._M_dataplus._M_p != paVar1) {
          operator_delete(value.mData._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_4e8);
        lVar13 = 0x20;
        do {
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_3c0 + lVar13) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        ((long)&uStack_3c0 + lVar13));
          }
          lVar13 = lVar13 + -0x10;
        } while (lVar13 != 0);
      }
      br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
      ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
      goto LAB_0015eb77;
    }
    testing::Message::Message((Message *)&br);
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var12 = local_498->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x37d,(char *)pp_Var12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_498 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0015eb77;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498->_vptr__Sp_counted_base !=
        local_498 + 1) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_498->_vptr__Sp_counted_base);
    }
  }
  operator_delete(local_498);
LAB_0015eb77:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StartCurrentNetworkSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[2] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(2)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(2).WillRepeatedly(Return(Error{}));
    // Will be omitted on domain start
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillRepeatedly(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start --nwk this");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression("start --dom this");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}